

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_line.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionPosition_line::ArchiveOUT(ChFunctionPosition_line *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChFunctionPosition>(marchive);
  ChFunctionPosition::ArchiveOUT(&this->super_ChFunctionPosition,marchive);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->trajectory_line;
  local_38._name = "trajectory_line";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::geometry::ChLine>
            (marchive,(ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> *)&local_38);
  local_38._value = &this->space_fx;
  local_38._name = "space_fx";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChFunctionPosition_line::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunctionPosition>();
	// serialize parent class
    ChFunctionPosition::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(trajectory_line);
	marchive << CHNVP(space_fx);

}